

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.cc
# Opt level: O2

void cnn::TensorTools::Zero(Tensor *d)

{
  Constant(d,0.0);
  return;
}

Assistant:

void TensorTools::Zero(Tensor& d) {
  Constant(d, 0);
}